

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_net.cpp
# Opt level: O3

bool Guest_WaitForOthers(void *userdata)

{
  int iVar1;
  sockaddr_in *address;
  in_addr *piVar2;
  ulong uVar3;
  PreGamePacket packet;
  undefined2 local_74;
  byte local_72;
  byte local_71;
  in_addr_t local_70;
  in_port_t iStack_6c;
  BYTE aBStack_6a [58];
  
  address = PreGet(&local_74,0x44,false);
  if (address != (sockaddr_in *)0x0) {
    do {
      if (((char)local_74 == '0') && (iVar1 = FindNode(address), iVar1 == 1)) {
        switch(local_74._1_1_) {
        case 2:
          I_FatalError("The host cancelled the game.");
          break;
        case 3:
          if (doomcom.numnodes == 2) {
            doomcom.numnodes = local_72 + 2;
            sendplayer[0] = local_71;
            doomcom.consoleplayer = (SWORD)local_71;
            (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Console player number: %d");
            if ((ulong)local_72 != 0) {
              piVar2 = &sendaddress[2].sin_addr;
              uVar3 = 0;
              do {
                piVar2->s_addr = (&local_70)[uVar3 * 2];
                ((sockaddr_in *)(piVar2 + -1))->sin_port =
                     *(in_port_t *)(aBStack_6a + uVar3 * 8 + -2);
                sendplayer[uVar3 + 2] = aBStack_6a[uVar3 * 8];
                ((sockaddr_in *)(piVar2 + -1))->sin_family = 2;
                uVar3 = uVar3 + 1;
                piVar2 = piVar2 + 4;
              } while (local_72 != uVar3);
            }
          }
          (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received All Here, sending ACK.");
          local_74 = 0x630;
          sendto(mysocket,&local_74,2,0,(sockaddr *)(sendaddress + 1),0x10);
          break;
        case 4:
          (*StartScreen->_vptr_FStartupScreen[6])(StartScreen,(ulong)local_71);
          break;
        case 7:
          (*StartScreen->_vptr_FStartupScreen[7])(StartScreen,"Received \"Go.\"");
          return true;
        }
      }
      address = PreGet(&local_74,0x44,false);
    } while (address != (sockaddr_in *)0x0);
  }
  local_74 = 0x130;
  sendto(mysocket,&local_74,2,0,(sockaddr *)(sendaddress + 1),0x10);
  return false;
}

Assistant:

bool Guest_WaitForOthers (void *userdata)
{
	sockaddr_in *from;
	PreGamePacket packet;

	while ( (from = PreGet (&packet, sizeof(packet), false)) )
	{
		if (packet.Fake != PRE_FAKE || FindNode(from) != 1)
		{
			continue;
		}
		switch (packet.Message)
		{
		case PRE_CONACK:
			StartScreen->NetProgress (packet.NumPresent);
			break;

		case PRE_ALLHERE:
			if (doomcom.numnodes == 2)
			{
				int node;

				doomcom.numnodes = packet.NumNodes + 2;
				sendplayer[0] = packet.ConsoleNum;	// My player number
				doomcom.consoleplayer = packet.ConsoleNum;
				StartScreen->NetMessage ("Console player number: %d", doomcom.consoleplayer);
				for (node = 0; node < packet.NumNodes; node++)
				{
					sendaddress[node+2].sin_addr.s_addr = packet.machines[node].address;
					sendaddress[node+2].sin_port = packet.machines[node].port;
					sendplayer[node+2] = packet.machines[node].player;

					// [JC] - fixes problem of games not starting due to
					// no address family being assigned to nodes stored in
					// sendaddress[] from the All Here packet.
					sendaddress[node+2].sin_family = AF_INET;
				}
			}

			StartScreen->NetMessage ("Received All Here, sending ACK.");
			packet.Fake = PRE_FAKE;
			packet.Message = PRE_ALLHEREACK;
			PreSend (&packet, 2, &sendaddress[1]);
			break;

		case PRE_GO:
			StartScreen->NetMessage ("Received \"Go.\"");
			return true;

		case PRE_DISCONNECT:
			I_FatalError ("The host cancelled the game.");
			break;
		}
	}

	packet.Fake = PRE_FAKE;
	packet.Message = PRE_KEEPALIVE;
	PreSend(&packet, 2, &sendaddress[1]);

	return false;
}